

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnPool.h
# Opt level: O1

void __thiscall HttpConnPool::addFreeConn(HttpConnPool *this,HttpConnPtr *conn)

{
  size_t *psVar1;
  _Node *p_Var2;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  p_Var2 = std::__cxx11::list<std::shared_ptr<HttpConn>,std::allocator<std::shared_ptr<HttpConn>>>::
           _M_create_node<std::shared_ptr<HttpConn>const&>
                     ((list<std::shared_ptr<HttpConn>,std::allocator<std::shared_ptr<HttpConn>>> *)
                      &this->freeConnPool_,conn);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->freeConnPool_).
            super__List_base<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<HttpConn>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpConn>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->usedConnMap_)._M_h);
  return;
}

Assistant:

void addFreeConn(HttpConnPtr conn) {
        baseLoop_->assertInLoopThread();
        freeConnPool_.push_back(conn);
        usedConnMap_.erase(conn->id());
    }